

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall PrintVisitor::visit(PrintVisitor *this,BinaryOpNode *node)

{
  ExpressionNode *pEVar1;
  ostream *poVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  PrintVisitor visitor;
  long *local_60;
  long local_58;
  long local_50 [2];
  undefined **local_40;
  ostream *local_38;
  int local_30;
  
  poVar2 = this->stream_;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"BinaryOpNode:\n",0xe);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_38 = this->stream_;
  local_30 = this->indentation_ + 1;
  local_40 = &PTR__Visitor_001e93c0;
  (**(code **)((long)(((node->leftOperand_)._M_t.
                       super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>
                       .super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl)->super_Node).
                     _vptr_Node + 0x10))();
  poVar2 = this->stream_;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
  cVar3 = std::
          _Hashtable<BinaryOperator,_std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<BinaryOperator>,_std::hash<BinaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&BinaryOperationNames_abi_cxx11_._M_h,&node->operator_);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)((long)cVar3.
                                                super__Node_iterator_base<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                ._M_cur + 0x10),
                        *(long *)((long)cVar3.
                                        super__Node_iterator_base<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                        ._M_cur + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    pEVar1 = (node->rightOperand_)._M_t.
             super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
             super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
             super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
    (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_40);
    return;
  }
  uVar4 = std::__throw_out_of_range("_Map_base::at");
  _Unwind_Resume(uVar4);
}

Assistant:

void PrintVisitor::visit(const BinaryOpNode& node)
{
  stream_ << indent() << "BinaryOpNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getLeftOperand().accept(visitor);
  stream_ << indent() << BinaryOperationNames.at(node.getOperation()) << "\n";
  node.getRightOperand().accept(visitor);
}